

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  Writer *pWVar1;
  Writer *pWVar2;
  int iVar3;
  _func_int **pp_Var4;
  MemTable *b;
  char *pcVar5;
  long in_RCX;
  Writer *pWVar6;
  undefined1 state [8];
  undefined8 __mutex;
  bool bVar7;
  Writer *last_writer;
  Writer w;
  undefined1 local_d0 [8];
  size_type sStack_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  MemTable *local_b0;
  long local_a8;
  Writer *local_a0;
  WriteBatch *local_98;
  undefined1 local_90 [8];
  Writer local_88;
  
  __mutex = options + 200;
  local_88.status.state_ = (char *)0x0;
  local_88.batch = (WriteBatch *)0x0;
  local_88.sync = false;
  local_88.done = false;
  port::CondVar::CondVar(&local_88.cv,(Mutex *)__mutex);
  local_88.done = false;
  local_88.sync = (bool)*(byte *)&(updates->rep_)._M_dataplus._M_p;
  local_98 = updates;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_d0 = (undefined1  [8])&local_88;
  if (*(long **)(options + 0x198) == (long *)(*(long *)(options + 0x1a8) + -8)) {
    std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
    _M_push_back_aux<leveldb::DBImpl::Writer*>
              ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
               (options + 0x168),(Writer **)local_d0);
  }
  else {
    **(long **)(options + 0x198) = (long)&local_88;
    *(long *)(options + 0x198) = *(long *)(options + 0x198) + 8;
  }
  if (local_88.done == false) {
    while (&local_88 != (Writer *)**(long **)(options + 0x178)) {
      local_d0 = (undefined1  [8])local_88.cv.mu_;
      sStack_c8._0_1_ = true;
      std::condition_variable::wait((unique_lock *)&local_88.cv);
      local_d0 = (undefined1  [8])0x0;
      sStack_c8 = (ulong)sStack_c8._1_7_ << 8;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d0);
      if (local_88.done != false) goto LAB_0010ec6e;
    }
    MakeRoomForWrite(this,SUB81(options,0));
    local_a8 = *(long *)(*(long *)(options + 0x228) + 0x58);
    state = (undefined1  [8])(this->super_DB)._vptr_DB;
    pWVar6 = &local_88;
    local_c0._M_allocated_capacity = __mutex;
    local_a0 = &local_88;
    if (in_RCX != 0 && state == (undefined1  [8])0x0) {
      b = (MemTable *)BuildBatchGroup((DBImpl *)options,&local_a0);
      WriteBatchInternal::SetSequence((WriteBatch *)b,local_a8 + 1);
      local_c0._12_4_ = WriteBatchInternal::Count((WriteBatch *)b);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      local_d0 = (undefined1  [8])(((string *)&b->comparator_)->_M_dataplus)._M_p;
      sStack_c8 = ((string *)&b->comparator_)->_M_string_length;
      local_b0 = b;
      log::Writer::AddRecord((Writer *)local_90,*(Slice **)(options + 0x158));
      (this->super_DB)._vptr_DB = (_func_int **)local_90;
      if (local_90 == (undefined1  [8])0x0) {
        if (*(char *)&(local_98->rep_)._M_dataplus._M_p == '\x01') {
          (**(code **)(**(long **)(options + 0x148) + 0x28))(local_d0);
          (this->super_DB)._vptr_DB = (_func_int **)local_d0;
          bVar7 = local_d0 != (undefined1  [8])0x0;
          if (!bVar7) goto LAB_0010ed92;
        }
        else {
          bVar7 = false;
LAB_0010ed92:
          WriteBatchInternal::InsertInto((WriteBatch *)local_d0,local_b0);
          (this->super_DB)._vptr_DB = (_func_int **)local_d0;
        }
        state = local_d0;
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar3 != 0) {
LAB_0010eec6:
          std::__throw_system_error(iVar3);
        }
        if (bVar7) {
          RecordBackgroundError((DBImpl *)options,(Status *)this);
        }
      }
      else {
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        state = local_90;
        if (iVar3 != 0) goto LAB_0010eec6;
      }
      if (local_b0 == *(MemTable **)(options + 0x1b8)) {
        WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
      }
      if ((ulong)(local_a8 + (int)local_c0._12_4_) < *(ulong *)(*(long *)(options + 0x228) + 0x58))
      {
        __assert_fail("s >= last_sequence_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.h"
                      ,0xd8,"void leveldb::VersionSet::SetLastSequence(uint64_t)");
      }
      *(long *)(*(long *)(options + 0x228) + 0x58) = local_a8 + (int)local_c0._12_4_;
      pWVar6 = local_a0;
    }
    do {
      pWVar1 = (Writer *)**(long **)(options + 0x178);
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 (options + 0x168));
      if (pWVar1 != &local_88) {
        pWVar2 = (Writer *)(pWVar1->status).state_;
        if ((undefined1  [8])pWVar2 != state) {
          if (pWVar2 != (Writer *)0x0) {
            operator_delete__(pWVar2);
          }
          if (state == (undefined1  [8])0x0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Status::CopyState((char *)state);
          }
          (pWVar1->status).state_ = pcVar5;
        }
        pWVar1->done = true;
        std::condition_variable::notify_one();
      }
    } while (pWVar1 != pWVar6);
    __mutex = local_c0._M_allocated_capacity;
    if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
      std::condition_variable::notify_one();
      __mutex = local_c0._M_allocated_capacity;
    }
  }
  else {
LAB_0010ec6e:
    if (local_88.status.state_ == (char *)0x0) {
      pp_Var4 = (_func_int **)0x0;
    }
    else {
      pp_Var4 = (_func_int **)Status::CopyState(local_88.status.state_);
    }
    (this->super_DB)._vptr_DB = pp_Var4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::condition_variable::~condition_variable(&local_88.cv.cv_);
  if (local_88.status.state_ != (char *)0x0) {
    operator_delete__(local_88.status.state_);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* updates = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(updates, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(updates);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(updates));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(updates, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (updates == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}